

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseConnectionPoint(StructuralParser *this)

{
  char *pcVar1;
  bool bVar2;
  CallOrCast *pCVar3;
  QualifiedIdentifier *args_00;
  Expression *pEVar4;
  CommaSeparatedList *pCVar5;
  pool_ptr<soul::AST::CommaSeparatedList> args;
  pool_ptr<soul::AST::Expression> specialisationArgs;
  Context errorPos;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  UTF8Reader local_80;
  Context local_78;
  pool_ptr<soul::AST::Expression> local_60;
  UTF8Reader local_58;
  CompileMessage local_50;
  
  getContext(&local_78,this);
  pcVar1 = (this->super_SOULTokeniser).location.location.data;
  tryToParseExpressionIgnoringErrors((StructuralParser *)local_90);
  if (local_90 == (undefined1  [8])0x0) {
    local_58.data = pcVar1;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::resetPosition(&this->super_SOULTokeniser,&local_58);
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3337);
    if (!bVar2) {
      Errors::expectedProcessorOrEndpoint<>();
      AST::Context::throwError(&local_78,&local_50,false);
    }
    args_00 = parseQualifiedIdentifier(this);
    local_90 = (undefined1  [8])0x0;
    parseSpecialisationArgs((StructuralParser *)local_88);
    if (CONCAT71(local_88._1_7_,local_88[0]) != 0) {
      cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_80,&local_60);
      local_90 = (undefined1  [8])local_80.data;
      if ((CommaSeparatedList *)local_80.data == (CommaSeparatedList *)0x0) {
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)local_88);
        local_90 = (undefined1  [8])
                   allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                             (this,&(pEVar4->super_Statement).super_ASTObject.context);
        pCVar5 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                           ((pool_ptr<soul::AST::CommaSeparatedList> *)local_90);
        local_80.data =
             (char *)pool_ptr<soul::AST::Expression>::operator*
                               ((pool_ptr<soul::AST::Expression> *)local_88);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar5->items,(pool_ref<soul::AST::Expression> *)&local_80);
      }
    }
    local_88[0] = false;
    pCVar3 = allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
                       (this,args_00,(pool_ptr<soul::AST::CommaSeparatedList> *)local_90,
                        (bool *)local_88);
  }
  else {
    pCVar3 = (CallOrCast *)
             pool_ptr<soul::AST::Expression>::operator*((pool_ptr<soul::AST::Expression> *)local_90)
    ;
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_78);
  return (Expression *)pCVar3;
}

Assistant:

AST::Expression& parseConnectionPoint()
    {
        auto errorPos = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (auto e = tryToParseExpressionIgnoringErrors())
            return *e;

        resetPosition (startPos);

        if (! matches (Token::identifier))
            errorPos.throwError (Errors::expectedProcessorOrEndpoint());

        auto& processorName = parseQualifiedIdentifier();
        pool_ptr<AST::CommaSeparatedList> args;

        if (auto specialisationArgs = parseSpecialisationArgs())
        {
            args = cast<AST::CommaSeparatedList> (specialisationArgs);

            if (args == nullptr)
            {
                args = allocate<AST::CommaSeparatedList> (specialisationArgs->context);
                args->items.push_back (*specialisationArgs);
            }
        }

        return allocate<AST::CallOrCast> (processorName, args, false);
    }